

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

void __thiscall Kernel::Clause::destroy(Clause *this)

{
  bool bVar1;
  int iVar2;
  ProofExtra PVar3;
  Clause *this_00;
  Clause *in_RDI;
  Clause *refCl;
  Unit *refU;
  Iterator it;
  Clause *cl;
  Clause *in_stack_ffffffffffffffb8;
  Clause *in_stack_ffffffffffffffc8;
  Clause *in_stack_ffffffffffffffd0;
  anon_union_8_2_756040a0_for_Iterator_0 local_28;
  Clause *local_20;
  
  local_20 = in_RDI;
  if ((destroy()::toDestroy == '\0') &&
     (iVar2 = __cxa_guard_acquire(&destroy()::toDestroy), local_20 = in_RDI, iVar2 != 0)) {
    Lib::Stack<Kernel::Clause_*>::Stack
              ((Stack<Kernel::Clause_*> *)in_stack_ffffffffffffffd0,
               (size_t)in_stack_ffffffffffffffc8);
    __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&destroy::toDestroy,&__dso_handle);
    __cxa_guard_release(&destroy()::toDestroy);
    local_20 = in_RDI;
  }
  while( true ) {
    PVar3 = Shell::Options::proofExtra(Lib::env);
    if (PVar3 == FULL) {
      Lib::ProofExtra::remove((ProofExtra *)0x1333858,(char *)local_20);
    }
    local_28 = (anon_union_8_2_756040a0_for_Iterator_0)
               Inference::iterator(&(local_20->super_Unit)._inference);
    while (bVar1 = Inference::hasNext(&(local_20->super_Unit)._inference,(Iterator *)&local_28),
          bVar1) {
      this_00 = (Clause *)Inference::next((Inference *)in_stack_ffffffffffffffc8,(Iterator *)in_RDI)
      ;
      bVar1 = Unit::isClause((Unit *)this_00);
      in_stack_ffffffffffffffd0 = this_00;
      if (bVar1) {
        this_00->_refCnt = this_00->_refCnt - 1;
        bVar1 = shouldBeDestroyed(in_RDI);
        in_stack_ffffffffffffffc8 = this_00;
        if (bVar1) {
          Lib::Stack<Kernel::Clause_*>::push
                    ((Stack<Kernel::Clause_*> *)in_RDI,in_stack_ffffffffffffffb8);
          in_stack_ffffffffffffffc8 = this_00;
        }
      }
    }
    Inference::destroyDirectlyOwned((Inference *)in_stack_ffffffffffffffd0);
    destroyExceptInferenceObject(in_stack_ffffffffffffffd0);
    bVar1 = Lib::Stack<Kernel::Clause_*>::isEmpty(&destroy::toDestroy);
    if (bVar1) break;
    local_20 = Lib::Stack<Kernel::Clause_*>::pop(&destroy::toDestroy);
  }
  return;
}

Assistant:

void Clause::destroy()
{
  static Stack<Clause*> toDestroy(32);
  Clause* cl = this;
  for(;;) {
    if (env.options->proofExtra() == Options::ProofExtra::FULL) {
      env.proofExtra.remove(cl);
    }
    Inference::Iterator it = cl->_inference.iterator();
    while (cl->_inference.hasNext(it)) {
      Unit* refU = cl->_inference.next(it);
      if (!refU->isClause()) {
        continue;
      }
      Clause* refCl = static_cast<Clause*> (refU);
      refCl->_refCnt--;
      if (refCl->shouldBeDestroyed()) {
        toDestroy.push(refCl);
      }
    }
    cl->_inference.destroyDirectlyOwned();
    cl->destroyExceptInferenceObject();
    if (toDestroy.isEmpty()) {
      break;
    }
    cl = toDestroy.pop();
  }
}